

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void auto_commit_space_used_test(void)

{
  fdb_file_info finfo;
  int r;
  char fname [32];
  int i;
  int ntimes;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffbf8;
  ulong local_3d8;
  fdb_file_info *in_stack_fffffffffffffc30;
  fdb_file_handle *in_stack_fffffffffffffc38;
  undefined1 local_3a0 [248];
  undefined1 local_2a8 [72];
  fdb_kvs_config *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  fdb_kvs_handle **in_stack_fffffffffffffdb0;
  fdb_file_handle *in_stack_fffffffffffffdb8;
  fdb_config *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  fdb_file_handle **in_stack_fffffffffffffe28;
  char local_1a8 [40];
  int local_180;
  int local_17c;
  undefined1 local_160 [4];
  int local_15c;
  undefined8 local_158;
  undefined1 local_147;
  fdb_status local_64;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_17c = 4;
  system("rm -rf  func_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_160,local_2a8,0xf8);
  local_158 = 0;
  local_147 = 1;
  fdb_get_default_config();
  memcpy(local_160,local_3a0,0xf8);
  fdb_get_default_kvs_config();
  local_180 = local_17c;
  do {
    if (local_180 == 0) {
      fdb_shutdown();
      memleak_end();
      if (auto_commit_space_used_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","auto_commit space used on close test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","auto_commit space used on close test");
      }
      return;
    }
    sprintf(local_1a8,"./func_test1");
    local_64 = fdb_open(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                        in_stack_fffffffffffffe18);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf23);
      auto_commit_space_used_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf23,"void auto_commit_space_used_test()");
      }
    }
    local_64 = fdb_kvs_open(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                            in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf25);
      auto_commit_space_used_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf25,"void auto_commit_space_used_test()");
      }
    }
    local_64 = fdb_get_file_info(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf29);
      auto_commit_space_used_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf29,"void auto_commit_space_used_test()");
      }
    }
    if (local_3d8 != (uint)(local_15c * 7)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf2c);
      auto_commit_space_used_test::__test_pass = 0;
      if (local_3d8 != (uint)(local_15c * 7)) {
        __assert_fail("finfo.file_size == fconfig.blocksize * 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf2c,"void auto_commit_space_used_test()");
      }
    }
    local_64 = fdb_close(in_stack_fffffffffffffbf8);
    if (local_64 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf2f);
      auto_commit_space_used_test::__test_pass = 0;
      if (local_64 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf2f,"void auto_commit_space_used_test()");
      }
    }
    local_180 = local_180 + -1;
  } while( true );
}

Assistant:

void auto_commit_space_used_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int ntimes = 4;
    int i;
    char fname[32];

    // remove previous func_test test files
    int r = system(SHELL_DEL" func_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= 0;
    fconfig.auto_commit = true;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    for (i = ntimes; i; --i) {
        sprintf(fname, "./func_test1");
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("auto_commit space used on close test");
}